

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalKdevelopGenerator::Generate(cmGlobalKdevelopGenerator *this)

{
  long lVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  cmGlobalGenerator *pcVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  string executable;
  string fileToOpen;
  string projectName;
  string projectDir;
  string outputDir;
  string cmakeFilePattern;
  allocator local_121;
  _Base_ptr local_120;
  cmGlobalKdevelopGenerator *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar4 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var6 = (pcVar4->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118 = this;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(pcVar4->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory
                       ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
    std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_b0);
    local_120 = p_Var6;
    pcVar5 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2))
    ;
    std::__cxx11::string::string((string *)&local_b0,pcVar5,(allocator *)&local_d0);
    p_Var6 = local_120 + 2;
    cmLocalGenerator::GetProjectName_abi_cxx11_
              (&local_d0,(cmLocalGenerator *)**(undefined8 **)p_Var6);
    std::__cxx11::string::string
              ((string *)&local_50,"CMakeLists.txt;*.cmake;",(allocator *)&local_f0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    bVar2 = CreateFilelistFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                     *)p_Var6,&local_70,&local_b0,&local_d0,&local_50,&local_f0);
    if (bVar2) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      p_Var6 = *(_Base_ptr *)(local_120 + 2);
      do {
        if (p_Var6 == local_120[2]._M_parent) break;
        lVar1 = *(long *)p_Var6;
        for (puVar7 = *(undefined8 **)(lVar1 + 0xe8); puVar7 != *(undefined8 **)(lVar1 + 0xf0);
            puVar7 = puVar7 + 1) {
          TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)*puVar7);
          if (TVar3 == EXECUTABLE) {
            this_00 = (cmGeneratorTarget *)*puVar7;
            std::__cxx11::string::string((string *)&local_90,"",&local_121);
            cmGeneratorTarget::GetLocation(this_00,&local_90);
            std::__cxx11::string::assign((char *)&local_110);
            std::__cxx11::string::~string((string *)&local_90);
            break;
          }
        }
        p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
      } while (local_110._M_string_length == 0);
      this = local_118;
      CreateProjectFile(local_118,&local_70,&local_b0,&local_d0,&local_110,&local_50,&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      cmSystemTools::Error("Can not create filelist file",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) {
      return;
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_120);
    pcVar4 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  } while( true );
}

Assistant:

void cmGlobalKdevelopGenerator::Generate()
{
  // for each sub project in the project create
  // a kdevelop project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    std::string outputDir=it->second[0]->GetCurrentBinaryDirectory();
    std::string projectDir=it->second[0]->GetSourceDirectory();
    std::string projectName=it->second[0]->GetProjectName();
    std::string cmakeFilePattern("CMakeLists.txt;*.cmake;");
    std::string fileToOpen;
    const std::vector<cmLocalGenerator*>& lgs= it->second;
    // create the project.kdevelop.filelist file
    if(!this->CreateFilelistFile(lgs, outputDir, projectDir,
                                 projectName, cmakeFilePattern, fileToOpen))
      {
      cmSystemTools::Error("Can not create filelist file");
      return;
      }
    //try to find the name of an executable so we have something to
    //run from kdevelop for now just pick the first executable found
    std::string executable;
    for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
         lg!=lgs.end(); lg++)
      {
      std::vector<cmGeneratorTarget*> const& targets =
          (*lg)->GetGeneratorTargets();
      for (std::vector<cmGeneratorTarget*>::const_iterator ti =
           targets.begin(); ti != targets.end(); ti++)
        {
        if ((*ti)->GetType()==cmState::EXECUTABLE)
          {
          executable = (*ti)->GetLocation("");
          break;
          }
        }
      if (!executable.empty())
        {
        break;
        }
      }

    // now create a project file
    this->CreateProjectFile(outputDir, projectDir, projectName,
                            executable, cmakeFilePattern, fileToOpen);
    }
}